

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3OffsetsFunc(sqlite3_context *pContext,int nVal,sqlite3_value **apVal)

{
  long lVar1;
  sqlite3_stmt *pStmt;
  undefined8 uVar2;
  sqlite3_vtab *psVar3;
  Fts3Cursor *pFVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  uchar *z;
  Mem *pMVar8;
  char **ppcVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  char **pp;
  char *z_00;
  code *xDel;
  bool bVar13;
  int iCurrent;
  int iEnd;
  int iStart;
  int NDUMMY;
  int iPhrase;
  TermOffsetCtx sCtx;
  StrBuffer res;
  Fts3Cursor *pCsr;
  char *ZDUMMY;
  int local_10c;
  int local_108;
  uint local_104;
  sqlite3_vtab *local_100;
  undefined4 local_f4;
  ulong local_f0;
  undefined8 local_e8;
  Fts3Cursor *local_e0;
  uint local_d4;
  sqlite3_context *local_d0;
  Fts3Cursor *local_c8;
  ulong uStack_c0;
  sqlite3_int64 local_b8;
  char **ppcStack_b0;
  StrBuffer local_a8;
  ulong local_98;
  ulong local_90;
  Fts3Cursor *local_88;
  undefined1 local_80 [8];
  Fts3Cursor *local_78;
  undefined8 uStack_70;
  
  iVar6 = fts3FunctionArg(pContext,"offsets",*apVal,&local_88);
  if ((iVar6 == 0) && (iVar6 = fts3CursorSeek(pContext,local_88), iVar6 == 0)) {
    local_100 = (local_88->base).pVtab;
    lVar1 = *(long *)local_100[3].pModule;
    local_a8.z = (char *)0x0;
    local_a8.n = 0;
    local_a8.nAlloc = 0;
    if (local_88->pExpr == (Fts3Expr *)0x0) {
      z_00 = "";
      iVar6 = 0;
      xDel = (_func_void_void_ptr *)0x0;
    }
    else {
      local_b8 = 0;
      ppcStack_b0 = (char **)0x0;
      local_c8 = (Fts3Cursor *)0x0;
      uStack_c0 = 0;
      uStack_70 = 0;
      local_e0 = local_88;
      local_78 = local_88;
      local_e8._0_4_ = 0;
      local_d0 = pContext;
      iVar6 = fts3ExprIterate2(local_88->pExpr,(int *)&local_e8,fts3ExprLoadDoclistsCb,&local_78);
      if (iVar6 == 0) {
        uVar11 = (ulong)uStack_70._4_4_;
        iVar6 = sqlite3_initialize();
        local_f0 = uVar11;
        if (iVar6 == 0) {
          ppcStack_b0 = (char **)sqlite3Malloc(uVar11 << 4);
        }
        else {
          ppcStack_b0 = (char **)0x0;
        }
        if (ppcStack_b0 == (char **)0x0) {
          iVar6 = 7;
        }
        else {
          local_b8 = local_e0->iPrevId;
          local_c8 = local_e0;
          if (*(int *)&local_100[2].pModule < 1) {
            iVar6 = 0;
            local_c8 = local_e0;
          }
          else {
            local_98 = local_f0 & 0xffffffff;
            iVar6 = 0;
            uVar11 = 0;
            do {
              pFVar4 = local_e0;
              local_f4 = 0;
              local_104 = 0;
              local_108 = 0;
              local_10c = 0;
              local_78 = (Fts3Cursor *)((ulong)local_78 & 0xffffffff00000000);
              uStack_c0 = uVar11;
              fts3ExprIterate2(local_e0->pExpr,(int *)&local_78,fts3ExprTermOffsetInit,&local_c8);
              uVar12 = (int)uVar11 + 1;
              local_90 = uVar11;
              z = sqlite3_column_text(pFVar4->pStmt,uVar12);
              iVar7 = sqlite3_column_bytes(pFVar4->pStmt,uVar12);
              local_d4 = uVar12;
              if (z == (uchar *)0x0) {
                pStmt = pFVar4->pStmt;
                pMVar8 = columnMem(pStmt,uVar12);
                uVar12._0_2_ = pMVar8->flags;
                uVar12._2_1_ = pMVar8->enc;
                uVar12._3_1_ = pMVar8->eSubtype;
                columnMallocFailure(pStmt);
                bVar13 = (0xaaaaaaaaU >> (uVar12 & 0x1f) & 1) != 0;
                cVar5 = bVar13 * '\x03' + '\x02';
                if (!bVar13) {
                  iVar6 = 7;
                }
              }
              else {
                iVar6 = sqlite3Fts3OpenTokenizer
                                  ((sqlite3_tokenizer *)local_100[3].pModule,pFVar4->iLangid,
                                   (char *)z,iVar7,(sqlite3_tokenizer_cursor **)&local_e8);
                if (iVar6 == 0) {
                  iVar7 = (**(code **)(lVar1 + 0x28))
                                    (CONCAT44(local_e8._4_4_,(int)local_e8),local_80,&local_f4,
                                     &local_104,&local_108,&local_10c);
                  uVar11 = local_f0;
                  while (iVar7 == 0) {
                    iVar6 = 0x7fffffff;
                    if ((int)uVar11 < 1) {
                      pp = (char **)0x0;
                    }
                    else {
                      pp = (char **)0x0;
                      ppcVar9 = ppcStack_b0;
                      uVar10 = local_98;
                      do {
                        if ((*ppcVar9 != (char *)0x0) &&
                           (iVar7 = *(int *)(ppcVar9 + 1) - *(int *)((long)ppcVar9 + 0xc),
                           iVar7 < iVar6)) {
                          pp = ppcVar9;
                          iVar6 = iVar7;
                        }
                        ppcVar9 = ppcVar9 + 2;
                        uVar10 = uVar10 - 1;
                      } while (uVar10 != 0);
                    }
                    if (pp == (char **)0x0) {
                      iVar7 = 0x65;
                    }
                    else {
                      if ((byte)**pp < 2) {
                        *pp = (char *)0x0;
                      }
                      else {
                        fts3GetDeltaPosition(pp,(int *)(pp + 1));
                      }
                      if (local_10c < iVar6) {
                        uVar2 = CONCAT44(local_e8._4_4_,(int)local_e8);
                        do {
                          iVar7 = (**(code **)(lVar1 + 0x28))
                                            (uVar2,local_80,&local_f4,&local_104,&local_108,
                                             &local_10c);
                          bVar13 = iVar7 == 0;
                          if (!bVar13) break;
                        } while (local_10c < iVar6);
                      }
                      else {
                        bVar13 = true;
                        iVar7 = 0;
                      }
                      if (bVar13) {
                        sqlite3_snprintf(0x40,(char *)&local_78,"%d %d %d %d ",local_90,
                                         (long)pp - (long)ppcStack_b0 >> 4,(ulong)local_104,
                                         local_108 - local_104);
                        iVar7 = fts3StringAppend(&local_a8,(char *)&local_78,-1);
                        uVar11 = local_f0;
                      }
                      else {
                        uVar11 = local_f0;
                        if ((iVar7 == 0x65) && (iVar7 = 0x65, *(long *)&local_100[3].nRef == 0)) {
                          iVar7 = 0x10b;
                        }
                      }
                    }
                  }
                  (**(code **)(lVar1 + 0x20))(CONCAT44(local_e8._4_4_,(int)local_e8));
                  iVar6 = iVar7;
                  if (iVar7 == 0x65) {
                    iVar6 = 0;
                  }
                  cVar5 = (iVar7 != 0x65) * '\x02';
                }
                else {
                  cVar5 = '\x02';
                }
              }
              if ((cVar5 != '\0') && (cVar5 != '\x05')) {
                if (cVar5 != '\x02') {
                  return;
                }
                break;
              }
              uVar11 = (ulong)local_d4;
            } while ((int)local_d4 < *(int *)&local_100[2].pModule);
          }
        }
      }
      sqlite3_free(ppcStack_b0);
      psVar3 = local_100;
      sqlite3_blob_close((sqlite3_blob *)local_100[0x13].zErrMsg);
      psVar3[0x13].zErrMsg = (char *)0x0;
      if (iVar6 != 0) {
        sqlite3_result_error_code(local_d0,iVar6);
        sqlite3_free(local_a8.z);
        return;
      }
      iVar6 = local_a8.n + -1;
      xDel = sqlite3_free;
      z_00 = local_a8.z;
      pContext = local_d0;
    }
    setResultStrOrError(pContext,z_00,iVar6,'\x01',xDel);
  }
  return;
}

Assistant:

static void fts3OffsetsFunc(
  sqlite3_context *pContext,      /* SQLite function call context */
  int nVal,                       /* Size of argument array */
  sqlite3_value **apVal           /* Array of arguments */
){
  Fts3Cursor *pCsr;               /* Cursor handle passed through apVal[0] */

  UNUSED_PARAMETER(nVal);

  assert( nVal==1 );
  if( fts3FunctionArg(pContext, "offsets", apVal[0], &pCsr) ) return;
  assert( pCsr );
  if( SQLITE_OK==fts3CursorSeek(pContext, pCsr) ){
    sqlite3Fts3Offsets(pContext, pCsr);
  }
}